

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::PointerBuilder::getCapability(PointerBuilder *this)

{
  SegmentReader *segment;
  CapTableReader *capTable;
  WirePointer *ref;
  int nestingLimit;
  undefined8 *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  PointerBuilder *this_local;
  
  segment = (SegmentReader *)*in_RSI;
  capTable = (CapTableReader *)in_RSI[1];
  ref = (WirePointer *)in_RSI[2];
  nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  OVar1 = WireHelpers::readCapabilityPointer((WireHelpers *)this,segment,capTable,ref,nestingLimit);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> PointerBuilder::getCapability() {
  return WireHelpers::readCapabilityPointer(
      segment, capTable, pointer, kj::maxValue);
}